

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeThrowRef(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this)

{
  ThrowRef *pTVar1;
  bool bVar2;
  Ok local_95;
  uint local_94;
  Err local_90;
  Err *local_60;
  Err *err;
  Result<wasm::Ok> _val;
  ThrowRef curr;
  IRBuilder *this_local;
  
  pTVar1 = (ThrowRef *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  ThrowRef::ThrowRef(pTVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitThrowRef
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar1);
  local_60 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_60 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_90,local_60);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_90);
    wasm::Err::~Err(&local_90);
  }
  local_94 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_94 == 0) {
    pTVar1 = Builder::makeThrowRef
                       (&this->builder,
                        (Expression *)
                        curr.super_SpecificExpression<(wasm::Expression::Id)56>.super_Expression.
                        type.id);
    push(this,(Expression *)pTVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_95);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeThrowRef() {
  ThrowRef curr;
  CHECK_ERR(visitThrowRef(&curr));
  push(builder.makeThrowRef(curr.exnref));
  return Ok{};
}